

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_check_ctr_renegotiate(mbedtls_ssl_context *ssl)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int out_ctr_cmp;
  int in_ctr_cmp;
  size_t ep_len;
  mbedtls_ssl_context *ssl_local;
  
  sVar3 = ssl_ep_len(ssl);
  if (((ssl->state == 0x10) && (ssl->renego_status != 3)) &&
     ((*(uint *)&ssl->conf->field_0x174 >> 0xe & 1) != 0)) {
    iVar1 = memcmp(ssl->in_ctr + sVar3,ssl->conf->renego_period + sVar3,8 - sVar3);
    iVar2 = memcmp(ssl->out_ctr + sVar3,ssl->conf->renego_period + sVar3,8 - sVar3);
    if ((iVar1 < 1) && (iVar2 < 1)) {
      ssl_local._4_4_ = 0;
    }
    else {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x196a,"record counter limit reached: renegotiate");
      ssl_local._4_4_ = mbedtls_ssl_renegotiate(ssl);
    }
  }
  else {
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_check_ctr_renegotiate( mbedtls_ssl_context *ssl )
{
    size_t ep_len = ssl_ep_len( ssl );
    int in_ctr_cmp;
    int out_ctr_cmp;

    if( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER ||
        ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_PENDING ||
        ssl->conf->disable_renegotiation == MBEDTLS_SSL_RENEGOTIATION_DISABLED )
    {
        return( 0 );
    }

    in_ctr_cmp = memcmp( ssl->in_ctr + ep_len,
                        ssl->conf->renego_period + ep_len, 8 - ep_len );
    out_ctr_cmp = memcmp( ssl->out_ctr + ep_len,
                          ssl->conf->renego_period + ep_len, 8 - ep_len );

    if( in_ctr_cmp <= 0 && out_ctr_cmp <= 0 )
    {
        return( 0 );
    }

    MBEDTLS_SSL_DEBUG_MSG( 1, ( "record counter limit reached: renegotiate" ) );
    return( mbedtls_ssl_renegotiate( ssl ) );
}